

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# runtime.cpp
# Opt level: O1

void __thiscall acto::core::runtime_t::execute(runtime_t *this)

{
  workers_t *pwVar1;
  mpsc_stack<acto::core::worker_t> *pmVar2;
  __pointer_type pwVar3;
  bool bVar4;
  __pid_t _Var5;
  object_t *obj;
  __pointer_type this_00;
  long lVar6;
  worker_t *__stat_loc;
  long lVar7;
  __pointer_type unaff_R14;
  bool bVar8;
  long local_50;
  
  local_50 = std::chrono::_V2::steady_clock::now();
  if (((this->active_)._M_base._M_i & 1U) != 0) {
    pwVar1 = &this->workers_;
    lVar7 = 2;
    do {
      while (bVar4 = intrusive::queue<acto::core::object_t,_acto::intrusive::spin_lock>::empty
                               (&this->queue_), !bVar4) {
        do {
          pwVar3 = (this->workers_).idle.head_._M_b._M_p;
          if (pwVar3 == (__pointer_type)0x0) {
            bVar4 = false;
            unaff_R14 = (__pointer_type)0x0;
          }
          else {
            pmVar2 = &(this->workers_).idle;
            LOCK();
            bVar8 = pwVar3 == (pmVar2->head_)._M_b._M_p;
            if (bVar8) {
              (pmVar2->head_)._M_b._M_p = (pwVar3->super_node<acto::core::worker_t>).next;
            }
            UNLOCK();
            bVar4 = true;
            if (bVar8) {
              (pwVar3->super_node<acto::core::worker_t>).next = (worker_t *)0x0;
              bVar4 = false;
              unaff_R14 = pwVar3;
            }
          }
        } while (bVar4);
        if (unaff_R14 == (__pointer_type)0x0) {
          if ((this->workers_).count.super___atomic_base<unsigned_long>._M_i <
              (this->workers_).reserved.super___atomic_base<unsigned_long>._M_i + this->m_processors
             ) {
LAB_00164a63:
            unaff_R14 = create_worker(this);
          }
          else {
            __stat_loc = (worker_t *)(lVar7 * 1000000000);
            _Var5 = event::wait(&this->idle_workers_event_,__stat_loc);
            do {
              pwVar3 = (this->workers_).idle.head_._M_b._M_p;
              if (pwVar3 == (__pointer_type)0x0) {
                bVar4 = false;
                unaff_R14 = (__pointer_type)0x0;
              }
              else {
                __stat_loc = (pwVar3->super_node<acto::core::worker_t>).next;
                pmVar2 = &(this->workers_).idle;
                LOCK();
                bVar8 = pwVar3 == (pmVar2->head_)._M_b._M_p;
                if (bVar8) {
                  (pmVar2->head_)._M_b._M_p = __stat_loc;
                }
                UNLOCK();
                bVar4 = true;
                if (bVar8) {
                  (pwVar3->super_node<acto::core::worker_t>).next = (worker_t *)0x0;
                  bVar4 = false;
                  unaff_R14 = pwVar3;
                }
              }
            } while (bVar4);
            if (_Var5 == 2 && unaff_R14 == (__pointer_type)0x0) {
              lVar7 = lVar7 + 2;
              if ((this->workers_).count.super___atomic_base<unsigned_long>._M_i < 0x200)
              goto LAB_00164a63;
              event::wait(&this->idle_workers_event_,__stat_loc);
              unaff_R14 = (worker_t *)0x0;
            }
            else if (2 < lVar7) {
              lVar7 = lVar7 + -2;
            }
          }
        }
        if (unaff_R14 != (worker_t *)0x0) {
          obj = intrusive::queue<acto::core::object_t,_acto::intrusive::spin_lock>::pop
                          (&this->queue_);
          if (obj == (object_t *)0x0) {
            do {
              pwVar3 = (this->workers_).idle.head_._M_b._M_p;
              (unaff_R14->super_node<acto::core::worker_t>).next = pwVar3;
              pmVar2 = &(this->workers_).idle;
              LOCK();
              bVar4 = pwVar3 == (pmVar2->head_)._M_b._M_p;
              if (bVar4) {
                (pmVar2->head_)._M_b._M_p = unaff_R14;
              }
              UNLOCK();
            } while (!bVar4);
          }
          else {
            worker_t::assign(unaff_R14,obj,(duration)0x1dcd6500);
          }
        }
      }
      if ((((this->terminating_)._M_base._M_i & 1U) == 0) &&
         (_Var5 = event::wait(&this->queue_event_,(void *)0xdf8475800), _Var5 != 2)) {
        lVar6 = std::chrono::_V2::steady_clock::now();
        if (60000000000 < lVar6 - local_50) {
          do {
            pwVar3 = (this->workers_).idle.head_._M_b._M_p;
            if (pwVar3 == (__pointer_type)0x0) {
              bVar4 = false;
              unaff_R14 = (worker_t *)0x0;
            }
            else {
              pmVar2 = &(this->workers_).idle;
              LOCK();
              bVar8 = pwVar3 == (pmVar2->head_)._M_b._M_p;
              if (bVar8) {
                (pmVar2->head_)._M_b._M_p = (pwVar3->super_node<acto::core::worker_t>).next;
              }
              UNLOCK();
              bVar4 = true;
              if (bVar8) {
                (pwVar3->super_node<acto::core::worker_t>).next = (worker_t *)0x0;
                bVar4 = false;
                unaff_R14 = pwVar3;
              }
            }
          } while (bVar4);
          if (unaff_R14 != (worker_t *)0x0) {
            worker_t::~worker_t(unaff_R14);
            operator_delete(unaff_R14,0x98);
            LOCK();
            (pwVar1->count).super___atomic_base<unsigned_long>._M_i =
                 (pwVar1->count).super___atomic_base<unsigned_long>._M_i - 1;
            UNLOCK();
            if ((pwVar1->count).super___atomic_base<unsigned_long>._M_i == 0) {
              event::signaled(&this->no_workers_event_);
            }
          }
          local_50 = std::chrono::_V2::steady_clock::now();
        }
      }
      else {
        do {
          pwVar3 = (this->workers_).idle.head_._M_b._M_p;
          if (pwVar3 == (__pointer_type)0x0) {
            this_00 = (worker_t *)0x0;
            break;
          }
          pmVar2 = &(this->workers_).idle;
          LOCK();
          this_00 = (pmVar2->head_)._M_b._M_p;
          bVar4 = pwVar3 == this_00;
          if (bVar4) {
            (pmVar2->head_)._M_b._M_p = (__pointer_type)0x0;
            this_00 = pwVar3;
          }
          UNLOCK();
        } while (!bVar4);
        do {
          unaff_R14 = this_00;
          if (this_00 == (worker_t *)0x0) break;
          unaff_R14 = (this_00->super_node<acto::core::worker_t>).next;
          (this_00->super_node<acto::core::worker_t>).next = (worker_t *)0x0;
          worker_t::~worker_t(this_00);
          operator_delete(this_00,0x98);
          LOCK();
          (pwVar1->count).super___atomic_base<unsigned_long>._M_i =
               (pwVar1->count).super___atomic_base<unsigned_long>._M_i - 1;
          UNLOCK();
          if ((pwVar1->count).super___atomic_base<unsigned_long>._M_i == 0) {
            event::signaled(&this->no_workers_event_);
          }
          bVar4 = this_00 != (worker_t *)0x0;
          this_00 = unaff_R14;
        } while (bVar4);
      }
    } while (((this->active_)._M_base._M_i & 1U) != 0);
  }
  return;
}

Assistant:

void runtime_t::execute() {
  auto last_cleanup_time = std::chrono::steady_clock::now();
  auto new_worker_timeout = std::chrono::seconds(2);

  auto delete_worker = [this](worker_t* const item) {
    delete item;
    // Уведомить, что удалены все вычислительные потоки
    if (--workers_.count == 0) {
      no_workers_event_.signaled();
    }
  };

  while (active_) {
    while (!queue_.empty()) {
      // Прежде чем извлекать объект из очереди, необходимо проверить,
      // что есть вычислительные ресурсы для его обработки
      worker_t* worker = workers_.idle.pop();

      if (!worker) {
        // Если текущее количество потоков меньше оптимального,
        // то создать новый поток
        if (workers_.count < (workers_.reserved + m_processors)) {
          worker = create_worker();
        } else {
          // Подождать некоторое время осовобождения какого-нибудь потока
          const wait_result result =
            idle_workers_event_.wait(new_worker_timeout);

          worker = workers_.idle.pop();

          if (!worker && (result == wait_result::timeout)) {
            new_worker_timeout += std::chrono::seconds(2);

            if (workers_.count < MAX_WORKERS) {
              worker = create_worker();
            } else {
              idle_workers_event_.wait();
            }
          } else if (new_worker_timeout > std::chrono::seconds(2)) {
            new_worker_timeout -= std::chrono::seconds(2);
          }
        }
      }

      if (worker) {
        if (object_t* const obj = queue_.pop()) {
          worker->assign(obj, std::chrono::milliseconds(500));
        } else {
          workers_.idle.push(worker);
        }
      }
    }

    if (terminating_ ||
        (queue_event_.wait(std::chrono::seconds(60)) == wait_result::timeout))
    {
      auto idle_workers = workers_.idle.extract();
      // Stop all idle threads.
      while (worker_t* const item = idle_workers.pop_front()) {
        delete_worker(item);
      }
    } else if ((std::chrono::steady_clock::now() - last_cleanup_time) >
               std::chrono::seconds(60))
    {
      if (worker_t* const item = workers_.idle.pop()) {
        delete_worker(item);
      }

      last_cleanup_time = std::chrono::steady_clock::now();
    }
  }
}